

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_conv_transpose_2d(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  undefined2 *puVar10;
  size_t __n;
  char *pcVar11;
  undefined2 *puVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined8 uVar18;
  long lVar19;
  undefined2 *puVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  ggml_fp16_t *y;
  int64_t iVar25;
  int64_t iVar26;
  undefined1 auVar27 [16];
  long local_108;
  long local_100;
  long local_f8;
  undefined2 *local_f0;
  long local_e0;
  ggml_fp16_t *local_d0;
  long local_c8;
  long local_c0;
  ggml_fp16_t *local_b8;
  float v;
  long local_a8;
  long local_a0;
  long local_98;
  ggml_tensor *local_90;
  ulong local_88;
  int64_t local_80;
  ggml_compute_params *local_78;
  size_t local_70;
  size_t local_68;
  int64_t local_60;
  long local_58;
  size_t local_50;
  size_t local_48;
  long local_40;
  long local_38;
  
  pgVar2 = dst->src[0];
  if (pgVar2->type == GGML_TYPE_F16) {
    pgVar3 = dst->src[1];
    if (pgVar3->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        if (pgVar2->nb[0] == 2) {
          if (pgVar3->nb[0] == 4) {
            local_98 = pgVar2->ne[0];
            lVar4 = pgVar2->ne[1];
            lVar16 = pgVar2->ne[3];
            local_60 = dst->ne[0];
            lVar22 = pgVar2->ne[2];
            iVar25 = dst->ne[2];
            local_48 = dst->nb[2];
            iVar26 = pgVar3->ne[0];
            local_a8 = pgVar3->ne[1];
            lVar5 = pgVar3->ne[2];
            iVar13 = params->ith;
            uVar24 = params->nth;
            local_a0 = lVar16 * local_98;
            iVar8 = (int)local_a0;
            local_90 = dst;
            local_58 = lVar16;
            local_40 = iVar26;
            if (iVar13 == 0) {
              local_70 = pgVar2->nb[3];
              local_50 = pgVar3->nb[1];
              sVar6 = pgVar2->nb[2];
              local_68 = pgVar3->nb[2];
              local_88 = (ulong)uVar24;
              local_80 = iVar25;
              memset(params->wdata,0,params->wsize);
              iVar26 = local_40;
              iVar25 = local_80;
              local_f0 = (undefined2 *)params->wdata;
              if (0 < lVar16) {
                local_c0 = 0;
                lVar21 = 0;
                do {
                  if (0 < lVar22) {
                    lVar15 = 0;
                    lVar17 = (long)pgVar2->data + local_c0;
                    puVar10 = local_f0;
                    do {
                      if (0 < lVar4) {
                        lVar19 = 0;
                        lVar14 = lVar17;
                        puVar20 = puVar10;
                        do {
                          if (0 < local_98) {
                            lVar23 = 0;
                            puVar12 = puVar20;
                            do {
                              lVar1 = lVar23 * 2;
                              lVar23 = lVar23 + 1;
                              *puVar12 = *(undefined2 *)(lVar14 + lVar1);
                              puVar12 = puVar12 + lVar16;
                            } while (local_98 != lVar23);
                          }
                          lVar19 = lVar19 + 1;
                          lVar14 = lVar14 + local_98 * 2;
                          puVar20 = puVar20 + local_a0;
                        } while (lVar19 != lVar4);
                      }
                      lVar17 = lVar17 + sVar6;
                      lVar15 = lVar15 + 1;
                      puVar10 = puVar10 + local_a0 * lVar4;
                    } while (lVar15 != lVar22);
                  }
                  local_f0 = local_f0 + 1;
                  local_c0 = local_c0 + local_70;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != local_58);
              }
              uVar24 = (uint)local_88;
              if (0 < lVar5) {
                lVar16 = 0;
                lVar21 = 0;
                do {
                  if (0 < local_a8) {
                    lVar15 = 0;
                    lVar17 = (long)pgVar3->data + lVar16;
                    do {
                      if (0 < local_40) {
                        lVar14 = 0;
                        do {
                          lVar19 = lVar14 * 4;
                          lVar14 = lVar14 + 1;
                          auVar27 = vcvtps2ph_f16c(ZEXT416(*(uint *)(lVar17 + lVar19)),0);
                          vpextrw_avx(auVar27,0);
                        } while (local_40 != lVar14);
                      }
                      lVar17 = lVar17 + local_50;
                      lVar15 = lVar15 + 1;
                    } while (lVar15 != local_a8);
                  }
                  lVar16 = lVar16 + local_68;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != lVar5);
              }
              pvVar7 = local_90->data;
              local_78 = params;
              __n = ggml_nbytes();
              memset(pvVar7,0,__n);
              params = local_78;
            }
            local_108 = (long)((int)lVar4 * (int)lVar22 * iVar8) * 2;
            ggml_barrier(params->threadpool);
            lVar16 = local_58;
            iVar8 = (int)iVar25;
            iVar9 = (int)(iVar8 + -1 + uVar24) / (int)uVar24;
            iVar13 = iVar13 * iVar9;
            iVar9 = iVar9 + iVar13;
            if (iVar8 <= iVar9) {
              iVar9 = iVar8;
            }
            local_88 = CONCAT44(local_88._4_4_,iVar9);
            if (iVar13 < iVar9) {
              pvVar7 = params->wdata;
              local_80 = (int64_t)iVar13;
              lVar22 = local_a0 * lVar4;
              local_e0 = local_48 * local_80;
              local_a0 = local_a0 * 2;
              local_68 = (long)local_90->op_params[0] << 2;
              local_38 = lVar22 * 2;
              local_78 = (ggml_compute_params *)(local_60 * local_90->op_params[0] * 4);
              local_d0 = (ggml_fp16_t *)((long)pvVar7 + lVar22 * local_80 * 2);
              lVar22 = local_98;
              local_60 = local_60 << 2;
              do {
                if (0 < local_a8) {
                  local_100 = 0;
                  local_f8 = (long)local_90->data + local_e0;
                  do {
                    if (0 < iVar26) {
                      local_f0 = (undefined2 *)0x0;
                      local_70 = local_100 * iVar26;
                      local_c8 = local_f8;
                      do {
                        if (0 < lVar4) {
                          lVar21 = (long)local_f0 + local_70;
                          lVar17 = 0;
                          local_b8 = local_d0;
                          local_50 = local_c8;
                          do {
                            if (0 < lVar22) {
                              lVar15 = 0;
                              y = local_b8;
                              do {
                                v = 0.0;
                                ggml_vec_dot_f16((int)lVar16,&v,0,
                                                 (ggml_fp16_t *)
                                                 ((long)pvVar7 +
                                                 (lVar21 * (lVar5 << 0x20) >> 0x1f) + local_108),0,y
                                                 ,0,1);
                                y = y + lVar16;
                                *(float *)(local_50 + lVar15 * 4) =
                                     v + *(float *)(local_50 + lVar15 * 4);
                                lVar15 = lVar15 + 1;
                                lVar22 = local_98;
                              } while (local_98 != lVar15);
                            }
                            local_50 = local_50 + local_60;
                            local_b8 = (ggml_fp16_t *)((long)local_b8 + local_a0);
                            lVar17 = lVar17 + 1;
                          } while (lVar17 != lVar4);
                        }
                        local_c8 = local_c8 + local_68;
                        local_f0 = (undefined2 *)((long)local_f0 + 1);
                        iVar26 = local_40;
                      } while (local_f0 != (undefined2 *)local_40);
                    }
                    local_f8 = local_f8 + (long)local_78;
                    local_100 = local_100 + 1;
                  } while (local_100 != local_a8);
                }
                local_e0 = local_e0 + local_48;
                local_d0 = (ggml_fp16_t *)((long)local_d0 + local_38);
                local_80 = local_80 + 1;
              } while ((int)local_88 != (int)local_80);
            }
            return;
          }
          pcVar11 = "nb10 == sizeof(float)";
          uVar18 = 0x1768;
        }
        else {
          pcVar11 = "nb00 == sizeof(ggml_fp16_t)";
          uVar18 = 0x1767;
        }
      }
      else {
        pcVar11 = "dst->type == GGML_TYPE_F32";
        uVar18 = 0x175e;
      }
    }
    else {
      pcVar11 = "src1->type == GGML_TYPE_F32";
      uVar18 = 0x175d;
    }
  }
  else {
    pcVar11 = "src0->type == GGML_TYPE_F16";
    uVar18 = 0x175c;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar18,"GGML_ASSERT(%s) failed",pcVar11);
}

Assistant:

void ggml_compute_forward_conv_transpose_2d(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];

    GGML_ASSERT(src0->type == GGML_TYPE_F16);
    GGML_ASSERT(src1->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    GGML_TENSOR_BINARY_OP_LOCALS

    const int ith = params->ith;
    const int nth = params->nth;

    const int nk = ne00*ne01*ne02*ne03;

    GGML_ASSERT(nb00 == sizeof(ggml_fp16_t));
    GGML_ASSERT(nb10 == sizeof(float));

    if (ith == 0) {
        memset(params->wdata, 0, params->wsize);

        // permute kernel data (src0) from (Kw x Kh x Cout x Cin) to (Cin x Kw x Kh x Cout)
        {
            ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + 0;

            for (int64_t i03 = 0; i03 < ne03; i03++) {
                for (int64_t i02 = 0; i02 < ne02; i02++) {
                    const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i03*nb03 + i02*nb02);
                    ggml_fp16_t * dst_data = wdata + i02*ne01*ne00*ne03;
                    for (int64_t i01 = 0; i01 < ne01; i01++) {
                        for (int64_t i00 = 0; i00 < ne00; i00++) {
                            dst_data[i01*ne00*ne03 + i00*ne03 + i03] = src[i01 * ne00 + i00];
                        }
                    }
                }
            }
        }

        // permute source data (src1) from (Sw x Sh x Cin) to (Cin x Sw x Sh)
        {
            ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + nk;
            for (int i12 = 0; i12 < ne12; i12++) {
                for (int i11 = 0; i11 < ne11; i11++) {
                    const float * const src = (float *)((char *) src1->data + i12*nb12 + i11*nb11);
                    ggml_fp16_t * dst_data = wdata + i11*ne10*ne12;
                    for (int i10 = 0; i10 < ne10; i10++) {
                        dst_data[i10*ne12 + i12] = GGML_FP32_TO_FP16(src[i10]);
                    }
                }
            }
        }

        memset(dst->data, 0, ggml_nbytes(dst));
    }
    ggml_barrier(params->threadpool);

    const int32_t stride = ggml_get_op_params_i32(dst, 0);

    // total patches in dst
    const int np = ne2;

    // patches per thread
    const int dp = (np + nth - 1)/nth;

    // patch range for this thread
    const int ip0 = dp*ith;
    const int ip1 = MIN(ip0 + dp, np);

    ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + 0;
    ggml_fp16_t * const wdata_src = wdata + nk;

    for (int i2 = ip0; i2 < ip1; i2++) { // Cout
        float * dst_data = (float *)((char *) dst->data + i2*nb2);
        ggml_fp16_t * wdata_kernel = wdata + i2*ne01*ne00*ne03;
        for (int i11 = 0; i11 < ne11; i11++) {
            for (int i10 = 0; i10 < ne10; i10++) {
                const int i1n = i11*ne10*ne12 + i10*ne12;
                for (int i01 = 0; i01 < ne01; i01++) {
                    for (int i00 = 0; i00 < ne00; i00++) {
                        float v = 0;
                        ggml_vec_dot_f16(ne03, &v, 0,
                                wdata_src + i1n, 0,
                                wdata_kernel + i01*ne00*ne03 + i00*ne03, 0, 1);
                        dst_data[(i11*stride + i01)*ne0 + i10*stride + i00] += v;
                    }
                }
            }
        }
    }
}